

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O3

uint8_t __thiscall
GmmLib::PlatformInfoGen12::OverrideCompressionFormat
          (PlatformInfoGen12 *this,GMM_RESOURCE_FORMAT Format,uint8_t IsMC)

{
  byte bVar1;
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 aVar2;
  byte bVar3;
  byte bVar4;
  
  bVar1 = (this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.Data.
          FormatTable[Format].CompressionFormat.CompressionFormat;
  aVar2 = (((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
           pGmmLibContext)->SkuTable).field_1;
  if (((ulong)aVar2 >> 0x22 & 1) == 0) {
    bVar4 = bVar1;
    if (((ulong)aVar2 & 0x42000000) != 0) {
      if (IsMC == '\0') {
        bVar3 = bVar1;
        if (7 < bVar1) {
          bVar3 = 0x30;
        }
        if (((ulong)aVar2 & 0x40000000) != 0) {
          bVar3 = bVar1;
        }
        bVar4 = 0x30;
        if (bVar3 < 0x20) {
          bVar4 = bVar3;
        }
        if (((ulong)aVar2 & 0x40000000) == 0) {
          bVar4 = bVar3;
        }
      }
      else {
        if ((aVar2._0_4_ >> 0x1e & 1) == 0) {
          if (0xe < (byte)(bVar1 - 0x21)) {
            if (3 < bVar1) {
              return 0x30;
            }
            return (byte)(0xe0a3001 >> ((bVar1 & 3) << 3));
          }
        }
        else if (0xe < (byte)(bVar1 - 0x21)) {
          if (8 < (byte)(bVar1 - 4)) {
            return 0x30;
          }
          return (&DAT_001bb994)[(byte)(bVar1 - 4)];
        }
        bVar4 = bVar1 - 0x20;
      }
    }
  }
  else {
    bVar4 = 0x10;
    if (bVar1 < 0x10) {
      bVar4 = bVar1;
    }
  }
  return bVar4;
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::OverrideCompressionFormat(GMM_RESOURCE_FORMAT Format, uint8_t IsMC)
{

    uint8_t CompressionFormat = Data.FormatTable[Format].CompressionFormat.CompressionFormat;
    if (pGmmLibContext->GetSkuTable().FtrXe2Compression)
    {
        if ((CompressionFormat < GMM_XE2_UNIFIED_COMP_MIN_FORMAT) ||
            (CompressionFormat > GMM_XE2_UNIFIED_COMP_MAX_FORMAT))
        {
            CompressionFormat = GMM_XE2_UNIFIED_COMP_FORMAT_INVALID;
        }
        __GMM_ASSERT(CompressionFormat != GMM_XE2_UNIFIED_COMP_FORMAT_INVALID);
    }
    else if (pGmmLibContext->GetSkuTable().FtrFlatPhysCCS || pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
    {
        if(!IsMC &&
           !pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_FLATCCS_MIN_RC_FORMAT ||
            CompressionFormat > GMM_FLATCCS_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
        }

	if(!IsMC &&
           pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats &&
           (CompressionFormat < GMM_UNIFIED_COMP_MIN_RC_FORMAT ||
            CompressionFormat > GMM_UNIFIED_COMP_MAX_RC_FORMAT))
        {
            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
        }
	else if(IsMC)
        {
            if(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats)
            {
		if(CompressionFormat >= GMM_FLATCCS_MIN_MC_FORMAT && CompressionFormat <= GMM_FLATCCS_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_FLATCCS_FORMAT_RGB10A2:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGB10b;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA16U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_FLATCCS_FORMAT_RGBA8U:
                            CompressionFormat = GMM_FLATCCS_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_FLATCCS_MIN_MC_FORMAT || CompressionFormat > GMM_FLATCCS_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_FLATCCS_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_FLATCCS_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_FLATCCS_MIN_MC_FORMAT - 1);
                    }
                }
	    }
            else
            {
                if(CompressionFormat >= GMM_UNIFIED_COMP_MIN_MC_FORMAT && CompressionFormat <= GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                {
                    //True MC format encodings, drop MC-identify bit (ie bit5)
                    CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                }
                else
                {
                    // RC format encoding, needs MC format encoding for MC usage
                    switch(CompressionFormat)
                    {
                        case GMM_UNIFIED_COMP_FORMAT_RGB10A2:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGB10b;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA16F:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_RGBA16_MEDIA;
                            break;
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8U:
                        case GMM_UNIFIED_COMP_FORMAT_RGBA8S:
                            CompressionFormat = GMM_UNIFIED_COMP_FORMAT_ARGB8b;
                            break;
                        default:
                            if(CompressionFormat < GMM_UNIFIED_COMP_MIN_MC_FORMAT || CompressionFormat > GMM_UNIFIED_COMP_MAX_MC_FORMAT)
                            {
                                CompressionFormat = GMM_UNIFIED_COMP_FORMAT_INVALID;
                            }
                            break;
                    }

                    if(CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID)
                    {
                        //drop MC-identify bit (ie bit 5)
                        CompressionFormat -= (GMM_UNIFIED_COMP_MIN_MC_FORMAT - 1);
                    }
		}
	    }
        }

	//Assert if out of MC/RC encoding range -ie format-table must be corrected for Compression code
        __GMM_ASSERT(!pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_FLATCCS_FORMAT_INVALID ||
                     pGmmLibContext->GetSkuTable().FtrUnified3DMediaCompressionFormats && CompressionFormat != GMM_UNIFIED_COMP_FORMAT_INVALID);
    }

    return CompressionFormat;
}